

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void __thiscall
CVmObjString::restore_from_file
          (CVmObjString *this,vm_obj_id_t param_2,CVmFile *fp,CVmObjFixup *param_4)

{
  uint uVar1;
  int iVar2;
  CVmVarHeap *pCVar3;
  undefined4 extraout_var;
  CVmFile *in_RCX;
  char *buf;
  CVmFile *in_RDI;
  size_t len;
  size_t in_stack_ffffffffffffffc8;
  
  uVar1 = CVmFile::read_uint2(in_RDI);
  buf = (char *)(ulong)uVar1;
  if (in_RDI->seek_base_ != 0) {
    pCVar3 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar3->_vptr_CVmVarHeap[6])(pCVar3,in_RDI->seek_base_);
    in_RDI->seek_base_ = 0;
  }
  pCVar3 = CVmMemory::get_var_heap(G_mem_X);
  iVar2 = (*pCVar3->_vptr_CVmVarHeap[4])(pCVar3,buf + 2,in_RDI);
  in_RDI->seek_base_ = CONCAT44(extraout_var,iVar2);
  vmb_put_len((char *)in_RDI,in_stack_ffffffffffffffc8);
  CVmFile::read_bytes(in_RCX,buf,(size_t)in_RDI);
  return;
}

Assistant:

void CVmObjString::restore_from_file(VMG_ vm_obj_id_t,
                                     CVmFile *fp, CVmObjFixup *)
{
    /* read the length prefix */
    size_t len = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* 
     *   allocate our extension - make room for the length prefix plus the
     *   bytes of the string
     */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(len + VMB_LEN, this);

    /* store our length prefix */
    vmb_put_len(ext_, len);

    /* read the string */
    fp->read_bytes(ext_ + VMB_LEN, len);
}